

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

bool __thiscall cmCTestCVS::UpdateImpl(cmCTestCVS *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvs_update;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  UpdateParser out;
  UpdateParser err;
  string local_16e8;
  string local_16c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16a8;
  undefined1 local_1690 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1668 [36];
  char *local_1428;
  char *local_11f8;
  char *local_fc8;
  char *local_d98;
  char *local_b68;
  undefined1 local_b58 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b30 [36];
  char *local_8f0;
  char *local_6c0;
  char *local_490;
  char *local_260;
  char *local_30;
  
  pcVar2 = (this->super_cmCTestVC).CTest;
  pcVar1 = local_1690 + 0x10;
  local_1690._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1690,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_16c8,pcVar2,(string *)local_1690);
  if ((pointer)local_1690._0_8_ != pcVar1) {
    operator_delete((void *)local_1690._0_8_,local_1690._16_8_ + 1);
  }
  if (local_16c8._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestVC).CTest;
    local_b58._0_8_ = local_b58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"CVSUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1690,pcVar2,(string *)local_b58);
    std::__cxx11::string::operator=((string *)&local_16c8,(string *)local_1690);
    if ((pointer)local_1690._0_8_ != pcVar1) {
      operator_delete((void *)local_1690._0_8_,local_1690._16_8_ + 1);
    }
    if ((undefined1 *)local_b58._0_8_ != local_b58 + 0x10) {
      operator_delete((void *)local_b58._0_8_,local_b58._16_8_ + 1);
    }
    if (local_16c8._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_16c8,0,(char *)0x0,0x928189);
    }
  }
  cmSystemTools::ParseArguments(&local_16a8,&local_16c8);
  iVar4 = cmCTest::GetTestModel((this->super_cmCTestVC).CTest);
  if (iVar4 == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_16e8,&this->super_cmCTestVC);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_16e8,0,(char *)0x0,0x96a445);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_b58._16_8_ = *psVar6;
      local_b58._24_8_ = plVar5[3];
      local_b58._0_8_ = local_b58 + 0x10;
    }
    else {
      local_b58._16_8_ = *psVar6;
      local_b58._0_8_ = (size_type *)*plVar5;
    }
    local_b58._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_b58);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_1690._16_8_ = *psVar6;
      local_1690._24_8_ = plVar5[3];
      local_1690._0_8_ = pcVar1;
    }
    else {
      local_1690._16_8_ = *psVar6;
      local_1690._0_8_ = (size_type *)*plVar5;
    }
    local_1690._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_16a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1690);
    if ((pointer)local_1690._0_8_ != pcVar1) {
      operator_delete((void *)local_1690._0_8_,local_1690._16_8_ + 1);
    }
    if ((undefined1 *)local_b58._0_8_ != local_b58 + 0x10) {
      operator_delete((void *)local_b58._0_8_,local_b58._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
      operator_delete(local_16e8._M_dataplus._M_p,local_16e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_16e8._M_dataplus._M_p = (pointer)0x0;
  local_16e8._M_string_length = 0;
  local_16e8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_16e8,&(this->super_cmCTestVC).CommandLineTool);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_16e8,
             (char (*) [4])"-z3");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_16e8,
             (char (*) [7])0x91f254);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_16e8,
             local_16e8._M_string_length,
             local_16a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_16a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  UpdateParser::UpdateParser((UpdateParser *)local_1690,this,"up-out> ");
  UpdateParser::UpdateParser((UpdateParser *)local_b58,this,"up-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    (&this->super_cmCTestVC,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_16e8,(OutputParser *)local_1690,(OutputParser *)local_b58,Auto);
  local_b58._0_8_ = &PTR__UpdateParser_00bd9a88;
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  if (local_260 != (char *)0x0) {
    operator_delete__(local_260);
  }
  if (local_490 != (char *)0x0) {
    operator_delete__(local_490);
  }
  if (local_6c0 != (char *)0x0) {
    operator_delete__(local_6c0);
  }
  if (local_8f0 != (char *)0x0) {
    operator_delete__(local_8f0);
  }
  local_b58._0_8_ = &PTR__LineParser_00bdd8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._24_8_ != local_b30) {
    operator_delete((void *)local_b58._24_8_,local_b30[0]._M_allocated_capacity + 1);
  }
  local_1690._0_8_ = &PTR__UpdateParser_00bd9a88;
  if (local_b68 != (char *)0x0) {
    operator_delete__(local_b68);
  }
  if (local_d98 != (char *)0x0) {
    operator_delete__(local_d98);
  }
  if (local_fc8 != (char *)0x0) {
    operator_delete__(local_fc8);
  }
  if (local_11f8 != (char *)0x0) {
    operator_delete__(local_11f8);
  }
  if (local_1428 != (char *)0x0) {
    operator_delete__(local_1428);
  }
  local_1690._0_8_ = &PTR__LineParser_00bdd8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1690._24_8_ != local_1668) {
    operator_delete((void *)local_1690._24_8_,local_1668[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_16e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16c8._M_dataplus._M_p != &local_16c8.field_2) {
    operator_delete(local_16c8._M_dataplus._M_p,local_16c8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestCVS::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("CVSUpdateOptions");
    if (opts.empty()) {
      opts = "-dP";
    }
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    args.push_back("-D" + this->GetNightlyTime() + " UTC");
  }

  // Run "cvs update" to update the work tree.
  std::vector<std::string> cvs_update;
  cvs_update.push_back(this->CommandLineTool);
  cvs_update.emplace_back("-z3");
  cvs_update.emplace_back("update");
  cm::append(cvs_update, args);

  UpdateParser out(this, "up-out> ");
  UpdateParser err(this, "up-err> ");
  return this->RunUpdateCommand(cvs_update, &out, &err);
}